

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatten_x86_avx2.cpp
# Opt level: O0

int __thiscall
ncnn::Flatten_x86_avx2::forward(Flatten_x86_avx2 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [24];
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  bool bVar19;
  float *pfVar20;
  undefined1 (*pauVar21) [16];
  long in_RCX;
  Mat *in_RDX;
  Mat *in_RSI;
  __m256 _v;
  int i_4;
  float *outptr;
  float *ptr_4;
  int q_2;
  __m128 tmp0_1;
  __m128 tmp1_1;
  __m128 tmp2_1;
  __m128 tmp3_1;
  __m128 _row3_3;
  __m128 _row2_3;
  __m128 _row1_3;
  __m128 _row0_3;
  int i_3;
  float *outptr3_3;
  float *outptr2_3;
  float *outptr1_3;
  float *outptr0_3;
  float *ptr_3;
  int q_1;
  __m256 _row7_1;
  __m256 _row6_1;
  __m256 _row5_1;
  __m256 _row4_1;
  __m256 _row3_2;
  __m256 _row2_2;
  __m256 _row1_2;
  __m256 _row0_2;
  int i_2;
  float *outptr7_1;
  float *outptr6_1;
  float *outptr5_1;
  float *outptr4_1;
  float *outptr3_2;
  float *outptr2_2;
  float *outptr1_2;
  float *outptr0_2;
  float *ptr_2;
  int q;
  __m128 tmp0;
  __m128 tmp1;
  __m128 tmp2;
  __m128 tmp3;
  __m128 _row3_1;
  __m128 _row2_1;
  __m128 _row1_1;
  __m128 _row0_1;
  int j_1;
  float *outptr3_1;
  float *outptr2_1;
  float *outptr1_1;
  float *outptr0_1;
  float *ptr_1;
  int i_1;
  __m256 _row7;
  __m256 _row6;
  __m256 _row5;
  __m256 _row4;
  __m256 _row3;
  __m256 _row2;
  __m256 _row1;
  __m256 _row0;
  int j;
  float *outptr7;
  float *outptr6;
  float *outptr5;
  float *outptr4;
  float *outptr3;
  float *outptr2;
  float *outptr1;
  float *outptr0;
  float *ptr;
  int i;
  size_t out_elemsize;
  int out_elempack;
  int total;
  int size;
  int elempack;
  size_t elemsize;
  int channels;
  int d;
  int h;
  int w;
  int dims;
  int elembits;
  __m256 __tt7_1;
  __m256 __tt6_1;
  __m256 __tt5_1;
  __m256 __tt4_1;
  __m256 __tt3_1;
  __m256 __tt2_1;
  __m256 __tt1_1;
  __m256 __tt0_1;
  __m256 __t7_1;
  __m256 __t6_1;
  __m256 __t5_1;
  __m256 __t4_1;
  __m256 __t3_1;
  __m256 __t2_1;
  __m256 __t1_1;
  __m256 __t0_1;
  __m256 __tt7;
  __m256 __tt6;
  __m256 __tt5;
  __m256 __tt4;
  __m256 __tt3;
  __m256 __tt2;
  __m256 __tt1;
  __m256 __tt0;
  __m256 __t7;
  __m256 __t6;
  __m256 __t5;
  __m256 __t4;
  __m256 __t3;
  __m256 __t2;
  __m256 __t1;
  __m256 __t0;
  Mat *in_stack_ffffffffffffe928;
  Mat *in_stack_ffffffffffffe930;
  Mat *pMVar22;
  size_t in_stack_ffffffffffffe938;
  undefined8 in_stack_ffffffffffffe940;
  int _w;
  Mat *in_stack_ffffffffffffe948;
  undefined4 in_stack_ffffffffffffe950;
  int in_stack_ffffffffffffe954;
  int local_1664;
  undefined1 (*local_1660) [32];
  Option *in_stack_ffffffffffffe9b8;
  Mat *in_stack_ffffffffffffe9c0;
  Mat *in_stack_ffffffffffffe9c8;
  Flatten *in_stack_ffffffffffffe9d0;
  undefined1 (*local_1610) [32];
  int local_1604;
  undefined8 local_1600;
  undefined8 uStack_15f8;
  undefined8 local_15f0;
  undefined8 uStack_15e8;
  undefined8 local_15e0;
  undefined8 uStack_15d8;
  undefined8 local_15d0;
  undefined8 uStack_15c8;
  undefined8 local_15c0;
  undefined8 uStack_15b8;
  undefined8 local_15b0;
  undefined8 uStack_15a8;
  undefined8 local_15a0;
  undefined8 uStack_1598;
  undefined8 local_1590;
  undefined8 uStack_1588;
  int local_157c;
  undefined1 (*local_1578) [16];
  float *local_1570;
  float *local_1568;
  float *local_1560;
  Option *in_stack_ffffffffffffead8;
  Mat *in_stack_ffffffffffffeae0;
  Mat *in_stack_ffffffffffffeae8;
  Flatten_x86_avx2 *in_stack_ffffffffffffeaf0;
  undefined1 (*pauVar23) [16];
  int local_1504;
  undefined8 local_1500;
  undefined8 uStack_14f8;
  undefined8 uStack_14f0;
  undefined8 uStack_14e8;
  undefined8 local_14e0;
  undefined8 uStack_14d8;
  undefined8 uStack_14d0;
  undefined8 uStack_14c8;
  undefined8 local_14c0;
  undefined8 uStack_14b8;
  undefined8 uStack_14b0;
  undefined8 uStack_14a8;
  undefined8 local_14a0;
  undefined8 uStack_1498;
  undefined8 uStack_1490;
  undefined8 uStack_1488;
  undefined8 local_1480;
  undefined8 uStack_1478;
  undefined8 uStack_1470;
  undefined8 uStack_1468;
  undefined8 local_1460;
  undefined8 uStack_1458;
  undefined8 uStack_1450;
  undefined8 uStack_1448;
  undefined8 local_1440;
  undefined8 uStack_1438;
  undefined8 uStack_1430;
  undefined8 uStack_1428;
  undefined1 local_1420 [32];
  int local_13ec;
  undefined1 (*local_13e8) [32];
  float *local_13e0;
  float *local_13d8;
  float *local_13d0;
  float *local_13c8;
  float *local_13c0;
  float *local_13b8;
  float *local_13b0;
  Mat local_1398;
  Mat *local_1350;
  int local_1344;
  undefined1 local_1340 [16];
  undefined1 local_1330 [16];
  undefined1 local_1320 [16];
  undefined1 local_1310 [16];
  undefined1 local_1300 [16];
  undefined1 local_12f0 [16];
  undefined1 local_12e0 [16];
  undefined1 local_12d0 [16];
  int local_12b4;
  undefined1 (*local_12b0) [16];
  float *local_12a8;
  float *local_12a0;
  float *local_1298;
  undefined1 (*local_1290) [16];
  int local_1284;
  undefined8 local_1280;
  undefined8 uStack_1278;
  undefined8 uStack_1270;
  undefined8 uStack_1268;
  undefined8 local_1260;
  undefined8 uStack_1258;
  undefined8 uStack_1250;
  undefined8 uStack_1248;
  undefined8 local_1240;
  undefined8 uStack_1238;
  undefined8 uStack_1230;
  undefined8 uStack_1228;
  undefined8 local_1220;
  undefined8 uStack_1218;
  undefined8 uStack_1210;
  undefined8 uStack_1208;
  undefined8 local_1200;
  undefined8 uStack_11f8;
  undefined8 uStack_11f0;
  undefined8 uStack_11e8;
  undefined8 local_11e0;
  undefined8 uStack_11d8;
  undefined8 uStack_11d0;
  undefined8 uStack_11c8;
  undefined8 local_11c0;
  undefined8 uStack_11b8;
  undefined8 uStack_11b0;
  undefined8 uStack_11a8;
  undefined1 local_11a0 [32];
  int local_117c;
  undefined1 (*local_1178) [32];
  float *local_1170;
  float *local_1168;
  float *local_1160;
  float *local_1158;
  float *local_1150;
  float *local_1148;
  float *local_1140;
  undefined1 (*local_1138) [32];
  int local_112c;
  size_t local_1128;
  int local_1120;
  int local_111c;
  int local_1118;
  int local_1114;
  ulong local_1110;
  int local_1108;
  int local_1104;
  int local_1100;
  int local_10fc;
  int local_10f8;
  int local_10f4;
  long local_10f0;
  Mat *local_10e8;
  Mat *local_10e0;
  int local_10cc;
  undefined1 (*local_10c8) [32];
  int **local_10c0;
  int *local_10b8;
  size_t *local_10b0;
  int *local_10a8;
  int *local_10a0;
  size_t *local_1098;
  Allocator **local_1090;
  Mat *local_1088;
  undefined1 (*local_1080) [32];
  undefined1 (*local_1078) [32];
  undefined1 (*local_1070) [32];
  undefined1 (*local_1068) [32];
  undefined1 (*local_1060) [32];
  undefined1 (*local_1058) [32];
  undefined1 (*local_1050) [32];
  undefined1 (*local_1048) [32];
  undefined1 local_1040 [32];
  undefined1 local_1020 [32];
  undefined1 local_1000 [32];
  undefined1 local_fe0 [32];
  undefined1 local_fc0 [32];
  undefined1 local_fa0 [32];
  undefined1 local_f80 [32];
  undefined1 local_f60 [32];
  undefined1 local_f40 [32];
  undefined1 local_f20 [32];
  undefined1 local_f00 [32];
  undefined1 local_ee0 [32];
  undefined1 local_ec0 [32];
  undefined1 local_ea0 [32];
  undefined1 local_e80 [32];
  undefined1 local_e60 [32];
  undefined8 *local_e40;
  undefined8 *local_e38;
  undefined8 *local_e30;
  undefined8 *local_e28;
  undefined8 *local_e20;
  undefined8 *local_e18;
  undefined8 *local_e10;
  undefined1 *local_e08;
  undefined1 local_e00 [32];
  undefined1 local_de0 [32];
  undefined1 local_dc0 [32];
  undefined1 local_da0 [32];
  undefined1 local_d80 [32];
  undefined1 local_d60 [32];
  undefined1 local_d40 [32];
  undefined1 local_d20 [32];
  undefined1 local_d00 [32];
  undefined1 local_ce0 [32];
  undefined1 local_cc0 [32];
  undefined1 local_ca0 [32];
  undefined1 local_c80 [32];
  undefined1 local_c60 [32];
  undefined1 local_c40 [32];
  undefined1 local_c20 [32];
  undefined8 *local_c00;
  undefined8 *local_bf8;
  undefined8 *local_bf0;
  undefined8 *local_be8;
  undefined8 *local_be0;
  undefined8 *local_bd8;
  undefined8 *local_bd0;
  undefined1 *local_bc8;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 uStack_bb0;
  undefined8 uStack_ba8;
  undefined1 (*local_b88) [32];
  undefined8 local_b80;
  undefined8 uStack_b78;
  undefined8 uStack_b70;
  undefined8 uStack_b68;
  undefined1 (*local_b48) [32];
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 uStack_b30;
  undefined8 uStack_b28;
  float *local_b08;
  undefined8 local_b00;
  undefined8 uStack_af8;
  undefined8 uStack_af0;
  undefined8 uStack_ae8;
  float *local_ac8;
  undefined8 local_ac0;
  undefined8 uStack_ab8;
  undefined8 uStack_ab0;
  undefined8 uStack_aa8;
  float *local_a88;
  undefined8 local_a80;
  undefined8 uStack_a78;
  undefined8 uStack_a70;
  undefined8 uStack_a68;
  float *local_a48;
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined8 uStack_a30;
  undefined8 uStack_a28;
  float *local_a08;
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  float *local_9c8;
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 uStack_9b0;
  undefined8 uStack_9a8;
  float *local_988;
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 uStack_970;
  undefined8 uStack_968;
  undefined1 (*local_948) [32];
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 uStack_930;
  undefined8 uStack_928;
  float *local_908;
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined8 uStack_8f0;
  undefined8 uStack_8e8;
  float *local_8c8;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 uStack_8b0;
  undefined8 uStack_8a8;
  float *local_888;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  float *local_848;
  undefined8 local_840;
  undefined8 uStack_838;
  undefined8 uStack_830;
  undefined8 uStack_828;
  float *local_808;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 uStack_7f0;
  undefined8 uStack_7e8;
  float *local_7c8;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 uStack_7b0;
  undefined8 uStack_7a8;
  float *local_788;
  undefined1 (*local_780) [16];
  undefined1 (*local_778) [16];
  undefined1 (*local_770) [16];
  undefined1 (*local_768) [16];
  undefined1 (*local_760) [16];
  undefined1 (*local_758) [16];
  undefined1 (*local_750) [16];
  undefined1 (*local_748) [16];
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 local_730;
  undefined8 uStack_728;
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 local_710;
  undefined8 uStack_708;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 local_6f0;
  undefined8 uStack_6e8;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 local_6d0;
  undefined8 uStack_6c8;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 local_6b0;
  undefined8 uStack_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 local_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 local_670;
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 local_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 local_630;
  undefined8 uStack_628;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 local_610;
  undefined8 uStack_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 local_5f0;
  undefined8 uStack_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 local_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 local_5b0;
  undefined8 uStack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 local_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 local_570;
  undefined8 uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 local_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined1 (*local_528) [16];
  undefined8 local_520;
  undefined8 uStack_518;
  float *local_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  float *local_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  float *local_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined1 (*local_4a8) [16];
  undefined8 local_4a0;
  undefined8 uStack_498;
  float *local_488;
  undefined8 local_480;
  undefined8 uStack_478;
  float *local_468;
  undefined8 local_460;
  undefined8 uStack_458;
  float *local_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 uStack_350;
  undefined8 uStack_348;
  int *local_340;
  size_t sStack_338;
  undefined8 uStack_330;
  Allocator *pAStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  size_t sStack_310;
  void *pvStack_308;
  size_t local_300;
  undefined8 uStack_2f8;
  Allocator *pAStack_2f0;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  size_t sStack_2d8;
  void *pvStack_2d0;
  int *piStack_2c8;
  undefined8 local_2c0;
  Allocator *pAStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  size_t local_2a0;
  void *pvStack_298;
  int *piStack_290;
  size_t sStack_288;
  Allocator *local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  int *local_140;
  size_t sStack_138;
  undefined8 uStack_130;
  Allocator *pAStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  size_t sStack_110;
  void *pvStack_108;
  size_t local_100;
  undefined8 uStack_f8;
  Allocator *pAStack_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  size_t sStack_d8;
  void *pvStack_d0;
  int *piStack_c8;
  undefined8 local_c0;
  Allocator *pAStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  size_t local_a0;
  void *pvStack_98;
  int *piStack_90;
  size_t sStack_88;
  Allocator *local_80;
  undefined8 uStack_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  
  _w = (int)((ulong)in_stack_ffffffffffffe940 >> 0x20);
  local_10f0 = in_RCX;
  local_10e8 = in_RDX;
  local_10e0 = in_RSI;
  local_10f4 = ncnn::Mat::elembits(in_RSI);
  if (local_10f4 == 8) {
    local_10cc = forward_int8(in_stack_ffffffffffffeaf0,in_stack_ffffffffffffeae8,
                              in_stack_ffffffffffffeae0,in_stack_ffffffffffffead8);
  }
  else {
    local_10f8 = local_10e0->dims;
    if (local_10f8 == 1) {
      ncnn::Mat::operator=(in_stack_ffffffffffffe930,in_stack_ffffffffffffe928);
      local_10cc = 0;
    }
    else {
      local_10fc = local_10e0->w;
      local_1100 = local_10e0->h;
      local_1104 = local_10e0->d;
      local_1108 = local_10e0->c;
      local_1110 = local_10e0->elemsize;
      local_1114 = local_10e0->elempack;
      local_1118 = local_10fc * local_1100 * local_1104;
      local_111c = local_1118 * local_1108 * local_1114;
      local_1120 = 1;
      if ((*(byte *)(local_10f0 + 0x27) & 1) != 0) {
        if (local_111c % 8 == 0) {
          in_stack_ffffffffffffe954 = 8;
          local_1120 = in_stack_ffffffffffffe954;
        }
        else {
          in_stack_ffffffffffffe954 = 1;
          local_1120 = in_stack_ffffffffffffe954;
          if (local_111c % 4 == 0) {
            in_stack_ffffffffffffe954 = 4;
            local_1120 = in_stack_ffffffffffffe954;
          }
        }
      }
      local_1128 = (local_1110 / (ulong)(long)local_1114) * (long)local_1120;
      if (local_1120 == 1) {
        local_10cc = Flatten::forward(in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,
                                      in_stack_ffffffffffffe9c0,in_stack_ffffffffffffe9b8);
      }
      else if ((local_10f8 == 2) && (local_1114 == 1)) {
        ncnn::Mat::operator=(in_stack_ffffffffffffe930,in_stack_ffffffffffffe928);
        local_10e8->dims = 1;
        local_10e8->w = local_111c / local_1120;
        local_10e8->h = 1;
        local_10e8->cstep = (long)local_10e8->w;
        local_10e8->elemsize = local_1128;
        local_10e8->elempack = local_1120;
        local_10cc = 0;
      }
      else {
        ncnn::Mat::create(in_stack_ffffffffffffe948,_w,in_stack_ffffffffffffe938,
                          (int)((ulong)in_stack_ffffffffffffe930 >> 0x20),
                          (Allocator *)in_stack_ffffffffffffe928);
        bVar19 = ncnn::Mat::empty(in_stack_ffffffffffffe928);
        if (bVar19) {
          local_10cc = -100;
        }
        else {
          if (local_10f8 == 2) {
            if (local_1114 == 8) {
              for (local_112c = 0; local_112c < local_1100; local_112c = local_112c + 1) {
                local_1138 = (undefined1 (*) [32])ncnn::Mat::row(local_10e0,local_112c);
                local_1140 = ncnn::Mat::operator_cast_to_float_(local_10e8);
                local_1140 = local_1140 + local_10fc * local_112c * 8;
                local_1148 = ncnn::Mat::operator_cast_to_float_(local_10e8);
                local_1148 = local_1148 + local_10fc * (local_112c * 8 + 1);
                local_1150 = ncnn::Mat::operator_cast_to_float_(local_10e8);
                local_1150 = local_1150 + local_10fc * (local_112c * 8 + 2);
                local_1158 = ncnn::Mat::operator_cast_to_float_(local_10e8);
                local_1158 = local_1158 + local_10fc * (local_112c * 8 + 3);
                local_1160 = ncnn::Mat::operator_cast_to_float_(local_10e8);
                local_1160 = local_1160 + local_10fc * (local_112c * 8 + 4);
                local_1168 = ncnn::Mat::operator_cast_to_float_(local_10e8);
                local_1168 = local_1168 + local_10fc * (local_112c * 8 + 5);
                local_1170 = ncnn::Mat::operator_cast_to_float_(local_10e8);
                local_1170 = local_1170 + local_10fc * (local_112c * 8 + 6);
                pfVar20 = ncnn::Mat::operator_cast_to_float_(local_10e8);
                local_1178 = (undefined1 (*) [32])(pfVar20 + local_10fc * (local_112c * 8 + 7));
                for (local_117c = 0; local_117c + 7 < local_10fc; local_117c = local_117c + 8) {
                  local_1048 = local_1138;
                  auVar7 = *(undefined1 (*) [24])*local_1138;
                  uStack_348 = *(undefined8 *)(*local_1138 + 0x18);
                  local_1050 = local_1138 + 1;
                  local_380 = *(undefined8 *)*local_1050;
                  uStack_378 = *(undefined8 *)(local_1138[1] + 8);
                  uStack_370 = *(undefined8 *)(local_1138[1] + 0x10);
                  uStack_368 = *(undefined8 *)(local_1138[1] + 0x18);
                  local_1058 = local_1138 + 2;
                  local_3a0 = *(undefined8 *)*local_1058;
                  uStack_398 = *(undefined8 *)(local_1138[2] + 8);
                  uStack_390 = *(undefined8 *)(local_1138[2] + 0x10);
                  uStack_388 = *(undefined8 *)(local_1138[2] + 0x18);
                  local_1060 = local_1138 + 3;
                  local_3c0 = *(undefined8 *)*local_1060;
                  uStack_3b8 = *(undefined8 *)(local_1138[3] + 8);
                  uStack_3b0 = *(undefined8 *)(local_1138[3] + 0x10);
                  uStack_3a8 = *(undefined8 *)(local_1138[3] + 0x18);
                  local_1068 = local_1138 + 4;
                  local_3e0 = *(undefined8 *)*local_1068;
                  uStack_3d8 = *(undefined8 *)(local_1138[4] + 8);
                  uStack_3d0 = *(undefined8 *)(local_1138[4] + 0x10);
                  uStack_3c8 = *(undefined8 *)(local_1138[4] + 0x18);
                  local_1070 = local_1138 + 5;
                  local_400 = *(undefined8 *)*local_1070;
                  uStack_3f8 = *(undefined8 *)(local_1138[5] + 8);
                  uStack_3f0 = *(undefined8 *)(local_1138[5] + 0x10);
                  uStack_3e8 = *(undefined8 *)(local_1138[5] + 0x18);
                  local_1078 = local_1138 + 6;
                  local_420 = *(undefined8 *)*local_1078;
                  uStack_418 = *(undefined8 *)(local_1138[6] + 8);
                  uStack_410 = *(undefined8 *)(local_1138[6] + 0x10);
                  uStack_408 = *(undefined8 *)(local_1138[6] + 0x18);
                  local_1080 = local_1138 + 7;
                  local_440 = *(undefined8 *)*local_1080;
                  uStack_438 = *(undefined8 *)(local_1138[7] + 8);
                  uStack_430 = *(undefined8 *)(local_1138[7] + 0x10);
                  uStack_428 = *(undefined8 *)(local_1138[7] + 0x18);
                  local_bc8 = local_11a0;
                  local_bd0 = &local_11c0;
                  local_bd8 = &local_11e0;
                  local_be0 = &local_1200;
                  local_be8 = &local_1220;
                  local_bf0 = &local_1240;
                  local_bf8 = &local_1260;
                  local_c00 = &local_1280;
                  local_11a0._0_8_ = auVar7._0_8_;
                  local_360 = local_11a0._0_8_;
                  local_11a0._8_8_ = auVar7._8_8_;
                  uStack_358 = local_11a0._8_8_;
                  local_11a0._16_8_ = auVar7._16_8_;
                  uStack_350 = local_11a0._16_8_;
                  local_c20 = vunpcklps_avx(*local_1138,*local_1050);
                  local_160 = local_11a0._0_8_;
                  uStack_158 = local_11a0._8_8_;
                  uStack_150 = local_11a0._16_8_;
                  local_c40 = vunpckhps_avx(*local_1138,*local_1050);
                  local_c60 = vunpcklps_avx(*local_1058,*local_1060);
                  local_c80 = vunpckhps_avx(*local_1058,*local_1060);
                  local_ca0 = vunpcklps_avx(*local_1068,*local_1070);
                  local_cc0 = vunpckhps_avx(*local_1068,*local_1070);
                  local_ce0 = vunpcklps_avx(*local_1078,*local_1080);
                  local_d00 = vunpckhps_avx(*local_1078,*local_1080);
                  local_d20 = vunpcklpd_avx(local_c20,local_c60);
                  local_d40 = vunpckhpd_avx(local_c20,local_c60);
                  local_d60 = vunpcklpd_avx(local_c40,local_c80);
                  local_d80 = vunpckhpd_avx(local_c40,local_c80);
                  local_da0 = vunpcklpd_avx(local_ca0,local_ce0);
                  local_dc0 = vunpckhpd_avx(local_ca0,local_ce0);
                  local_de0 = vunpcklpd_avx(local_cc0,local_d00);
                  local_e00 = vunpckhpd_avx(local_cc0,local_d00);
                  local_11a0 = vperm2f128_avx(local_d20,local_da0,0x20);
                  auVar6 = vperm2f128_avx(local_d40,local_dc0,0x20);
                  uStack_11a8 = auVar6._24_8_;
                  uStack_11b0 = auVar6._16_8_;
                  uStack_11b8 = auVar6._8_8_;
                  local_11c0 = auVar6._0_8_;
                  auVar6 = vperm2f128_avx(local_d60,local_de0,0x20);
                  uStack_11c8 = auVar6._24_8_;
                  uStack_11d0 = auVar6._16_8_;
                  uStack_11d8 = auVar6._8_8_;
                  local_11e0 = auVar6._0_8_;
                  auVar6 = vperm2f128_avx(local_d80,local_e00,0x20);
                  uStack_11e8 = auVar6._24_8_;
                  uStack_11f0 = auVar6._16_8_;
                  uStack_11f8 = auVar6._8_8_;
                  local_1200 = auVar6._0_8_;
                  auVar6 = vperm2f128_avx(local_d20,local_da0,0x31);
                  uStack_1208 = auVar6._24_8_;
                  uStack_1210 = auVar6._16_8_;
                  uStack_1218 = auVar6._8_8_;
                  local_1220 = auVar6._0_8_;
                  auVar6 = vperm2f128_avx(local_d40,local_dc0,0x31);
                  uStack_1228 = auVar6._24_8_;
                  uStack_1230 = auVar6._16_8_;
                  uStack_1238 = auVar6._8_8_;
                  local_1240 = auVar6._0_8_;
                  auVar6 = vperm2f128_avx(local_d60,local_de0,0x31);
                  uStack_1248 = auVar6._24_8_;
                  uStack_1250 = auVar6._16_8_;
                  uStack_1258 = auVar6._8_8_;
                  local_1260 = auVar6._0_8_;
                  auVar6 = vperm2f128_avx(local_d80,local_e00,0x31);
                  uStack_1268 = auVar6._24_8_;
                  uStack_1270 = auVar6._16_8_;
                  uStack_1278 = auVar6._8_8_;
                  local_1280 = auVar6._0_8_;
                  local_788 = local_1140;
                  local_7c0 = local_11a0._0_8_;
                  uStack_7b8 = local_11a0._8_8_;
                  uStack_7b0 = local_11a0._16_8_;
                  uStack_7a8 = local_11a0._24_8_;
                  *(undefined8 *)local_1140 = local_11a0._0_8_;
                  *(undefined8 *)(local_1140 + 2) = local_11a0._8_8_;
                  *(undefined8 *)(local_1140 + 4) = local_11a0._16_8_;
                  *(undefined8 *)(local_1140 + 6) = local_11a0._24_8_;
                  local_7c8 = local_1148;
                  local_800 = local_11c0;
                  uStack_7f8 = uStack_11b8;
                  uStack_7f0 = uStack_11b0;
                  uStack_7e8 = uStack_11a8;
                  *(undefined8 *)local_1148 = local_11c0;
                  *(undefined8 *)(local_1148 + 2) = uStack_11b8;
                  *(undefined8 *)(local_1148 + 4) = uStack_11b0;
                  *(undefined8 *)(local_1148 + 6) = uStack_11a8;
                  local_808 = local_1150;
                  local_840 = local_11e0;
                  uStack_838 = uStack_11d8;
                  uStack_830 = uStack_11d0;
                  uStack_828 = uStack_11c8;
                  *(undefined8 *)local_1150 = local_11e0;
                  *(undefined8 *)(local_1150 + 2) = uStack_11d8;
                  *(undefined8 *)(local_1150 + 4) = uStack_11d0;
                  *(undefined8 *)(local_1150 + 6) = uStack_11c8;
                  local_848 = local_1158;
                  local_880 = local_1200;
                  uStack_878 = uStack_11f8;
                  uStack_870 = uStack_11f0;
                  uStack_868 = uStack_11e8;
                  *(undefined8 *)local_1158 = local_1200;
                  *(undefined8 *)(local_1158 + 2) = uStack_11f8;
                  *(undefined8 *)(local_1158 + 4) = uStack_11f0;
                  *(undefined8 *)(local_1158 + 6) = uStack_11e8;
                  local_888 = local_1160;
                  local_8c0 = local_1220;
                  uStack_8b8 = uStack_1218;
                  uStack_8b0 = uStack_1210;
                  uStack_8a8 = uStack_1208;
                  *(undefined8 *)local_1160 = local_1220;
                  *(undefined8 *)(local_1160 + 2) = uStack_1218;
                  *(undefined8 *)(local_1160 + 4) = uStack_1210;
                  *(undefined8 *)(local_1160 + 6) = uStack_1208;
                  local_8c8 = local_1168;
                  local_900 = local_1240;
                  uStack_8f8 = uStack_1238;
                  uStack_8f0 = uStack_1230;
                  uStack_8e8 = uStack_1228;
                  *(undefined8 *)local_1168 = local_1240;
                  *(undefined8 *)(local_1168 + 2) = uStack_1238;
                  *(undefined8 *)(local_1168 + 4) = uStack_1230;
                  *(undefined8 *)(local_1168 + 6) = uStack_1228;
                  local_908 = local_1170;
                  local_940 = local_1260;
                  uStack_938 = uStack_1258;
                  uStack_930 = uStack_1250;
                  uStack_928 = uStack_1248;
                  *(undefined8 *)local_1170 = local_1260;
                  *(undefined8 *)(local_1170 + 2) = uStack_1258;
                  *(undefined8 *)(local_1170 + 4) = uStack_1250;
                  *(undefined8 *)(local_1170 + 6) = uStack_1248;
                  local_948 = local_1178;
                  local_980 = local_1280;
                  uStack_978 = uStack_1278;
                  uStack_970 = uStack_1270;
                  uStack_968 = uStack_1268;
                  *local_1178 = auVar6;
                  local_1140 = local_1140 + 8;
                  local_1148 = local_1148 + 8;
                  local_1150 = local_1150 + 8;
                  local_1158 = local_1158 + 8;
                  local_1160 = local_1160 + 8;
                  local_1168 = local_1168 + 8;
                  local_1170 = local_1170 + 8;
                  local_1178 = local_1178 + 1;
                  local_1138 = local_1138 + 8;
                  local_240 = local_440;
                  uStack_238 = uStack_438;
                  uStack_230 = uStack_430;
                  uStack_228 = uStack_428;
                  local_220 = local_420;
                  uStack_218 = uStack_418;
                  uStack_210 = uStack_410;
                  uStack_208 = uStack_408;
                  local_200 = local_400;
                  uStack_1f8 = uStack_3f8;
                  uStack_1f0 = uStack_3f0;
                  uStack_1e8 = uStack_3e8;
                  local_1e0 = local_3e0;
                  uStack_1d8 = uStack_3d8;
                  uStack_1d0 = uStack_3d0;
                  uStack_1c8 = uStack_3c8;
                  local_1c0 = local_3c0;
                  uStack_1b8 = uStack_3b8;
                  uStack_1b0 = uStack_3b0;
                  uStack_1a8 = uStack_3a8;
                  local_1a0 = local_3a0;
                  uStack_198 = uStack_398;
                  uStack_190 = uStack_390;
                  uStack_188 = uStack_388;
                  local_180 = local_380;
                  uStack_178 = uStack_378;
                  uStack_170 = uStack_370;
                  uStack_168 = uStack_368;
                  uStack_148 = uStack_348;
                }
                for (; local_117c < local_10fc; local_117c = local_117c + 1) {
                  *local_1140 = *(float *)*local_1138;
                  *local_1148 = *(float *)(*local_1138 + 4);
                  *local_1150 = *(float *)(*local_1138 + 8);
                  *local_1158 = *(float *)(*local_1138 + 0xc);
                  *local_1160 = *(float *)(*local_1138 + 0x10);
                  *local_1168 = *(float *)(*local_1138 + 0x14);
                  *local_1170 = *(float *)(*local_1138 + 0x18);
                  *(undefined4 *)*local_1178 = *(undefined4 *)(*local_1138 + 0x1c);
                  local_1138 = local_1138 + 1;
                  local_1178 = (undefined1 (*) [32])(*local_1178 + 4);
                  local_1170 = local_1170 + 1;
                  local_1168 = local_1168 + 1;
                  local_1160 = local_1160 + 1;
                  local_1158 = local_1158 + 1;
                  local_1150 = local_1150 + 1;
                  local_1148 = local_1148 + 1;
                  local_1140 = local_1140 + 1;
                }
              }
            }
            if (local_1114 == 4) {
              for (local_1284 = 0; local_1284 < local_1100; local_1284 = local_1284 + 1) {
                local_1290 = (undefined1 (*) [16])ncnn::Mat::row(local_10e0,local_1284);
                local_1298 = ncnn::Mat::operator_cast_to_float_(local_10e8);
                local_1298 = local_1298 + local_10fc * local_1284 * 4;
                local_12a0 = ncnn::Mat::operator_cast_to_float_(local_10e8);
                local_12a0 = local_12a0 + local_10fc * (local_1284 * 4 + 1);
                local_12a8 = ncnn::Mat::operator_cast_to_float_(local_10e8);
                local_12a8 = local_12a8 + local_10fc * (local_1284 * 4 + 2);
                pfVar20 = ncnn::Mat::operator_cast_to_float_(local_10e8);
                local_12b0 = (undefined1 (*) [16])(pfVar20 + local_10fc * (local_1284 * 4 + 3));
                for (local_12b4 = 0; local_12b4 + 3 < local_10fc; local_12b4 = local_12b4 + 4) {
                  local_748 = local_1290;
                  local_6d0 = *(undefined8 *)*local_1290;
                  uStack_6c8 = *(undefined8 *)(*local_1290 + 8);
                  local_750 = local_1290 + 1;
                  local_6e0 = *(undefined8 *)*local_750;
                  uStack_6d8 = *(undefined8 *)(local_1290[1] + 8);
                  local_758 = local_1290 + 2;
                  local_6f0 = *(undefined8 *)*local_758;
                  uStack_6e8 = *(undefined8 *)(local_1290[2] + 8);
                  local_760 = local_1290 + 3;
                  local_700 = *(undefined8 *)*local_760;
                  uStack_6f8 = *(undefined8 *)(local_1290[3] + 8);
                  local_1340 = vunpcklps_avx(*local_1290,*local_750);
                  local_1320 = vunpcklps_avx(*local_758,*local_760);
                  local_1330 = vunpckhps_avx(*local_1290,*local_750);
                  local_1310 = vunpckhps_avx(*local_758,*local_760);
                  local_5d0 = local_1340._0_8_;
                  uStack_5c8 = local_1340._8_8_;
                  local_5e0 = local_1320._0_8_;
                  uStack_5d8 = local_1320._8_8_;
                  local_12d0 = vunpcklpd_avx(local_1340,local_1320);
                  local_550 = local_1320._0_8_;
                  uStack_548 = local_1320._8_8_;
                  local_560 = local_1340._0_8_;
                  uStack_558 = local_1340._8_8_;
                  local_12e0 = vunpckhpd_avx(local_1340,local_1320);
                  local_5f0 = local_1330._0_8_;
                  uStack_5e8 = local_1330._8_8_;
                  local_600 = local_1310._0_8_;
                  uStack_5f8 = local_1310._8_8_;
                  local_12f0 = vunpcklpd_avx(local_1330,local_1310);
                  local_570 = local_1310._0_8_;
                  uStack_568 = local_1310._8_8_;
                  local_580 = local_1330._0_8_;
                  uStack_578 = local_1330._8_8_;
                  local_1300 = vunpckhpd_avx(local_1330,local_1310);
                  local_448 = local_1298;
                  local_460 = local_12d0._0_8_;
                  uStack_458 = local_12d0._8_8_;
                  *(undefined8 *)local_1298 = local_12d0._0_8_;
                  *(undefined8 *)(local_1298 + 2) = local_12d0._8_8_;
                  local_468 = local_12a0;
                  local_480 = local_12e0._0_8_;
                  uStack_478 = local_12e0._8_8_;
                  *(undefined8 *)local_12a0 = local_12e0._0_8_;
                  *(undefined8 *)(local_12a0 + 2) = local_12e0._8_8_;
                  local_488 = local_12a8;
                  local_4a0 = local_12f0._0_8_;
                  uStack_498 = local_12f0._8_8_;
                  *(undefined8 *)local_12a8 = local_12f0._0_8_;
                  *(undefined8 *)(local_12a8 + 2) = local_12f0._8_8_;
                  local_4a8 = local_12b0;
                  local_4c0 = local_1300._0_8_;
                  uStack_4b8 = local_1300._8_8_;
                  *local_12b0 = local_1300;
                  local_1290 = local_1290 + 4;
                  local_1298 = local_1298 + 4;
                  local_12a0 = local_12a0 + 4;
                  local_12a8 = local_12a8 + 4;
                  local_12b0 = local_12b0 + 1;
                  local_680 = local_700;
                  uStack_678 = uStack_6f8;
                  local_670 = local_6f0;
                  uStack_668 = uStack_6e8;
                  local_660 = local_6e0;
                  uStack_658 = uStack_6d8;
                  local_650 = local_6d0;
                  uStack_648 = uStack_6c8;
                }
                for (; local_12b4 < local_10fc; local_12b4 = local_12b4 + 1) {
                  *local_1298 = *(float *)*local_1290;
                  *local_12a0 = *(float *)(*local_1290 + 4);
                  *local_12a8 = *(float *)(*local_1290 + 8);
                  *(undefined4 *)*local_12b0 = *(undefined4 *)(*local_1290 + 0xc);
                  local_1290 = local_1290 + 1;
                  local_12b0 = (undefined1 (*) [16])(*local_12b0 + 4);
                  local_12a8 = local_12a8 + 1;
                  local_12a0 = local_12a0 + 1;
                  local_1298 = local_1298 + 1;
                }
              }
            }
          }
          if ((local_10f8 == 3) || (local_10f8 == 4)) {
            if (local_1114 == 8) {
              for (local_1344 = 0; local_1344 < local_1108; local_1344 = local_1344 + 1) {
                pMVar22 = &local_1398;
                ncnn::Mat::channel((Mat *)CONCAT44(in_stack_ffffffffffffe954,
                                                   in_stack_ffffffffffffe950),
                                   (int)((ulong)in_stack_ffffffffffffe948 >> 0x20));
                in_stack_ffffffffffffe948 = (Mat *)ncnn::Mat::operator_cast_to_float_(pMVar22);
                ncnn::Mat::~Mat((Mat *)0x38d275);
                local_1350 = in_stack_ffffffffffffe948;
                local_13b0 = ncnn::Mat::operator_cast_to_float_(local_10e8);
                local_13b0 = local_13b0 + local_1118 * local_1344 * 8;
                local_13b8 = ncnn::Mat::operator_cast_to_float_(local_10e8);
                local_13b8 = local_13b8 + local_1118 * (local_1344 * 8 + 1);
                local_13c0 = ncnn::Mat::operator_cast_to_float_(local_10e8);
                local_13c0 = local_13c0 + local_1118 * (local_1344 * 8 + 2);
                local_13c8 = ncnn::Mat::operator_cast_to_float_(local_10e8);
                local_13c8 = local_13c8 + local_1118 * (local_1344 * 8 + 3);
                local_13d0 = ncnn::Mat::operator_cast_to_float_(local_10e8);
                local_13d0 = local_13d0 + local_1118 * (local_1344 * 8 + 4);
                local_13d8 = ncnn::Mat::operator_cast_to_float_(local_10e8);
                local_13d8 = local_13d8 + local_1118 * (local_1344 * 8 + 5);
                local_13e0 = ncnn::Mat::operator_cast_to_float_(local_10e8);
                local_13e0 = local_13e0 + local_1118 * (local_1344 * 8 + 6);
                pfVar20 = ncnn::Mat::operator_cast_to_float_(local_10e8);
                local_13e8 = (undefined1 (*) [32])(pfVar20 + local_1118 * (local_1344 * 8 + 7));
                for (local_13ec = 0; local_13ec + 7 < local_1118; local_13ec = local_13ec + 8) {
                  local_1088 = local_1350;
                  uVar8 = local_1350->data;
                  uVar9 = local_1350->refcount;
                  uVar10 = local_1350->elemsize;
                  uStack_248 = *(undefined8 *)&local_1350->elempack;
                  auVar6._0_8_ = local_1350->data;
                  auVar6._8_8_ = local_1350->refcount;
                  auVar6._16_8_ = local_1350->elemsize;
                  auVar6._24_4_ = local_1350->elempack;
                  auVar6._28_4_ = *(undefined4 *)&local_1350->field_0x1c;
                  local_1090 = &local_1350->allocator;
                  local_280 = *local_1090;
                  uStack_278._0_4_ = local_1350->dims;
                  uStack_278._4_4_ = local_1350->w;
                  uStack_270._0_4_ = local_1350->h;
                  uStack_270._4_4_ = local_1350->d;
                  uStack_268 = *(undefined8 *)&local_1350->c;
                  auVar12._0_8_ = local_1350->allocator;
                  auVar12._8_4_ = local_1350->dims;
                  auVar12._12_4_ = local_1350->w;
                  auVar12._16_4_ = local_1350->h;
                  auVar12._20_4_ = local_1350->d;
                  auVar12._24_4_ = local_1350->c;
                  auVar12._28_4_ = *(undefined4 *)&local_1350->field_0x3c;
                  auVar11._0_8_ = local_1350->allocator;
                  auVar11._8_4_ = local_1350->dims;
                  auVar11._12_4_ = local_1350->w;
                  auVar11._16_4_ = local_1350->h;
                  auVar11._20_4_ = local_1350->d;
                  auVar11._24_4_ = local_1350->c;
                  auVar11._28_4_ = *(undefined4 *)&local_1350->field_0x3c;
                  local_1098 = &local_1350->cstep;
                  local_2a0 = *local_1098;
                  pvStack_298 = local_1350[1].data;
                  piStack_290 = local_1350[1].refcount;
                  sStack_288 = local_1350[1].elemsize;
                  local_10a0 = &local_1350[1].elempack;
                  local_2c0 = *(undefined8 *)local_10a0;
                  pAStack_2b8 = local_1350[1].allocator;
                  uStack_2b0._0_4_ = local_1350[1].dims;
                  uStack_2b0._4_4_ = local_1350[1].w;
                  uStack_2a8._0_4_ = local_1350[1].h;
                  uStack_2a8._4_4_ = local_1350[1].d;
                  auVar14._0_4_ = local_1350[1].elempack;
                  auVar14._4_4_ = *(undefined4 *)&local_1350[1].field_0x1c;
                  auVar14._8_8_ = local_1350[1].allocator;
                  auVar14._16_4_ = local_1350[1].dims;
                  auVar14._20_4_ = local_1350[1].w;
                  auVar14._24_4_ = local_1350[1].h;
                  auVar14._28_4_ = local_1350[1].d;
                  auVar13._0_4_ = local_1350[1].elempack;
                  auVar13._4_4_ = *(undefined4 *)&local_1350[1].field_0x1c;
                  auVar13._8_8_ = local_1350[1].allocator;
                  auVar13._16_4_ = local_1350[1].dims;
                  auVar13._20_4_ = local_1350[1].w;
                  auVar13._24_4_ = local_1350[1].h;
                  auVar13._28_4_ = local_1350[1].d;
                  local_10a8 = &local_1350[1].c;
                  local_2e0 = *(undefined8 *)local_10a8;
                  sStack_2d8 = local_1350[1].cstep;
                  pvStack_2d0 = local_1350[2].data;
                  piStack_2c8 = local_1350[2].refcount;
                  local_10b0 = &local_1350[2].elemsize;
                  local_300 = *local_10b0;
                  uStack_2f8 = *(undefined8 *)&local_1350[2].elempack;
                  pAStack_2f0 = local_1350[2].allocator;
                  uStack_2e8._0_4_ = local_1350[2].dims;
                  uStack_2e8._4_4_ = local_1350[2].w;
                  auVar16._0_8_ = local_1350[2].elemsize;
                  auVar16._8_4_ = local_1350[2].elempack;
                  auVar16._12_4_ = *(undefined4 *)&local_1350[2].field_0x1c;
                  auVar16._16_8_ = local_1350[2].allocator;
                  auVar16._24_4_ = local_1350[2].dims;
                  auVar16._28_4_ = local_1350[2].w;
                  auVar15._0_8_ = local_1350[2].elemsize;
                  auVar15._8_4_ = local_1350[2].elempack;
                  auVar15._12_4_ = *(undefined4 *)&local_1350[2].field_0x1c;
                  auVar15._16_8_ = local_1350[2].allocator;
                  auVar15._24_4_ = local_1350[2].dims;
                  auVar15._28_4_ = local_1350[2].w;
                  local_10b8 = &local_1350[2].h;
                  local_320._0_4_ = local_1350[2].h;
                  local_320._4_4_ = local_1350[2].d;
                  uStack_318 = *(undefined8 *)&local_1350[2].c;
                  sStack_310 = local_1350[2].cstep;
                  pvStack_308 = local_1350[3].data;
                  local_10c0 = &local_1350[3].refcount;
                  local_340 = *local_10c0;
                  sStack_338 = local_1350[3].elemsize;
                  uStack_330 = *(undefined8 *)&local_1350[3].elempack;
                  pAStack_328 = local_1350[3].allocator;
                  auVar18._0_8_ = local_1350[3].refcount;
                  auVar18._8_8_ = local_1350[3].elemsize;
                  auVar18._16_4_ = local_1350[3].elempack;
                  auVar18._20_4_ = *(undefined4 *)&local_1350[3].field_0x1c;
                  auVar18._24_8_ = local_1350[3].allocator;
                  auVar17._0_8_ = local_1350[3].refcount;
                  auVar17._8_8_ = local_1350[3].elemsize;
                  auVar17._16_4_ = local_1350[3].elempack;
                  auVar17._20_4_ = *(undefined4 *)&local_1350[3].field_0x1c;
                  auVar17._24_8_ = local_1350[3].allocator;
                  local_e08 = local_1420;
                  local_e10 = &local_1440;
                  local_e18 = &local_1460;
                  local_e20 = &local_1480;
                  local_e28 = &local_14a0;
                  local_e30 = &local_14c0;
                  local_e38 = &local_14e0;
                  local_e40 = &local_1500;
                  local_260 = uVar8;
                  uStack_258 = uVar9;
                  uStack_250 = uVar10;
                  local_e60 = vunpcklps_avx(auVar6,auVar11);
                  local_60 = uVar8;
                  uStack_58 = uVar9;
                  uStack_50 = uVar10;
                  local_e80 = vunpckhps_avx(auVar6,auVar12);
                  local_ea0 = vunpcklps_avx(*(undefined1 (*) [32])local_1098,auVar13);
                  local_ec0 = vunpckhps_avx(*(undefined1 (*) [32])local_1098,auVar14);
                  local_ee0 = vunpcklps_avx(*(undefined1 (*) [32])local_10a8,auVar15);
                  local_f00 = vunpckhps_avx(*(undefined1 (*) [32])local_10a8,auVar16);
                  local_f20 = vunpcklps_avx(*(undefined1 (*) [32])local_10b8,auVar17);
                  local_f40 = vunpckhps_avx(*(undefined1 (*) [32])local_10b8,auVar18);
                  local_f60 = vunpcklpd_avx(local_e60,local_ea0);
                  local_f80 = vunpckhpd_avx(local_e60,local_ea0);
                  local_fa0 = vunpcklpd_avx(local_e80,local_ec0);
                  local_fc0 = vunpckhpd_avx(local_e80,local_ec0);
                  local_fe0 = vunpcklpd_avx(local_ee0,local_f20);
                  local_1000 = vunpckhpd_avx(local_ee0,local_f20);
                  local_1020 = vunpcklpd_avx(local_f00,local_f40);
                  local_1040 = vunpckhpd_avx(local_f00,local_f40);
                  local_1420 = vperm2f128_avx(local_f60,local_fe0,0x20);
                  auVar6 = vperm2f128_avx(local_f80,local_1000,0x20);
                  uStack_1428 = auVar6._24_8_;
                  uStack_1430 = auVar6._16_8_;
                  uStack_1438 = auVar6._8_8_;
                  local_1440 = auVar6._0_8_;
                  auVar6 = vperm2f128_avx(local_fa0,local_1020,0x20);
                  uStack_1448 = auVar6._24_8_;
                  uStack_1450 = auVar6._16_8_;
                  uStack_1458 = auVar6._8_8_;
                  local_1460 = auVar6._0_8_;
                  auVar6 = vperm2f128_avx(local_fc0,local_1040,0x20);
                  uStack_1468 = auVar6._24_8_;
                  uStack_1470 = auVar6._16_8_;
                  uStack_1478 = auVar6._8_8_;
                  local_1480 = auVar6._0_8_;
                  auVar6 = vperm2f128_avx(local_f60,local_fe0,0x31);
                  uStack_1488 = auVar6._24_8_;
                  uStack_1490 = auVar6._16_8_;
                  uStack_1498 = auVar6._8_8_;
                  local_14a0 = auVar6._0_8_;
                  auVar6 = vperm2f128_avx(local_f80,local_1000,0x31);
                  uStack_14a8 = auVar6._24_8_;
                  uStack_14b0 = auVar6._16_8_;
                  uStack_14b8 = auVar6._8_8_;
                  local_14c0 = auVar6._0_8_;
                  auVar6 = vperm2f128_avx(local_fa0,local_1020,0x31);
                  uStack_14c8 = auVar6._24_8_;
                  uStack_14d0 = auVar6._16_8_;
                  uStack_14d8 = auVar6._8_8_;
                  local_14e0 = auVar6._0_8_;
                  auVar6 = vperm2f128_avx(local_fc0,local_1040,0x31);
                  uStack_14e8 = auVar6._24_8_;
                  uStack_14f0 = auVar6._16_8_;
                  uStack_14f8 = auVar6._8_8_;
                  local_1500 = auVar6._0_8_;
                  local_988 = local_13b0;
                  local_9c0 = local_1420._0_8_;
                  uStack_9b8 = local_1420._8_8_;
                  uStack_9b0 = local_1420._16_8_;
                  uStack_9a8 = local_1420._24_8_;
                  *(undefined8 *)local_13b0 = local_1420._0_8_;
                  *(undefined8 *)(local_13b0 + 2) = local_1420._8_8_;
                  *(undefined8 *)(local_13b0 + 4) = local_1420._16_8_;
                  *(undefined8 *)(local_13b0 + 6) = local_1420._24_8_;
                  local_9c8 = local_13b8;
                  local_a00 = local_1440;
                  uStack_9f8 = uStack_1438;
                  uStack_9f0 = uStack_1430;
                  uStack_9e8 = uStack_1428;
                  *(undefined8 *)local_13b8 = local_1440;
                  *(undefined8 *)(local_13b8 + 2) = uStack_1438;
                  *(undefined8 *)(local_13b8 + 4) = uStack_1430;
                  *(undefined8 *)(local_13b8 + 6) = uStack_1428;
                  local_a08 = local_13c0;
                  local_a40 = local_1460;
                  uStack_a38 = uStack_1458;
                  uStack_a30 = uStack_1450;
                  uStack_a28 = uStack_1448;
                  *(undefined8 *)local_13c0 = local_1460;
                  *(undefined8 *)(local_13c0 + 2) = uStack_1458;
                  *(undefined8 *)(local_13c0 + 4) = uStack_1450;
                  *(undefined8 *)(local_13c0 + 6) = uStack_1448;
                  local_a48 = local_13c8;
                  local_a80 = local_1480;
                  uStack_a78 = uStack_1478;
                  uStack_a70 = uStack_1470;
                  uStack_a68 = uStack_1468;
                  *(undefined8 *)local_13c8 = local_1480;
                  *(undefined8 *)(local_13c8 + 2) = uStack_1478;
                  *(undefined8 *)(local_13c8 + 4) = uStack_1470;
                  *(undefined8 *)(local_13c8 + 6) = uStack_1468;
                  local_a88 = local_13d0;
                  local_ac0 = local_14a0;
                  uStack_ab8 = uStack_1498;
                  uStack_ab0 = uStack_1490;
                  uStack_aa8 = uStack_1488;
                  *(undefined8 *)local_13d0 = local_14a0;
                  *(undefined8 *)(local_13d0 + 2) = uStack_1498;
                  *(undefined8 *)(local_13d0 + 4) = uStack_1490;
                  *(undefined8 *)(local_13d0 + 6) = uStack_1488;
                  local_ac8 = local_13d8;
                  local_b00 = local_14c0;
                  uStack_af8 = uStack_14b8;
                  uStack_af0 = uStack_14b0;
                  uStack_ae8 = uStack_14a8;
                  *(undefined8 *)local_13d8 = local_14c0;
                  *(undefined8 *)(local_13d8 + 2) = uStack_14b8;
                  *(undefined8 *)(local_13d8 + 4) = uStack_14b0;
                  *(undefined8 *)(local_13d8 + 6) = uStack_14a8;
                  local_b08 = local_13e0;
                  local_b40 = local_14e0;
                  uStack_b38 = uStack_14d8;
                  uStack_b30 = uStack_14d0;
                  uStack_b28 = uStack_14c8;
                  *(undefined8 *)local_13e0 = local_14e0;
                  *(undefined8 *)(local_13e0 + 2) = uStack_14d8;
                  *(undefined8 *)(local_13e0 + 4) = uStack_14d0;
                  *(undefined8 *)(local_13e0 + 6) = uStack_14c8;
                  local_b48 = local_13e8;
                  local_b80 = local_1500;
                  uStack_b78 = uStack_14f8;
                  uStack_b70 = uStack_14f0;
                  uStack_b68 = uStack_14e8;
                  *local_13e8 = auVar6;
                  local_13b0 = local_13b0 + 8;
                  local_13b8 = local_13b8 + 8;
                  local_13c0 = local_13c0 + 8;
                  local_13c8 = local_13c8 + 8;
                  local_13d0 = local_13d0 + 8;
                  local_13d8 = local_13d8 + 8;
                  local_13e0 = local_13e0 + 8;
                  local_13e8 = local_13e8 + 1;
                  local_1350 = (Mat *)&local_1350[3].dims;
                  local_140 = local_340;
                  sStack_138 = sStack_338;
                  uStack_130 = uStack_330;
                  pAStack_128 = pAStack_328;
                  local_120 = local_320;
                  uStack_118 = uStack_318;
                  sStack_110 = sStack_310;
                  pvStack_108 = pvStack_308;
                  local_100 = local_300;
                  uStack_f8 = uStack_2f8;
                  pAStack_f0 = pAStack_2f0;
                  uStack_e8 = uStack_2e8;
                  local_e0 = local_2e0;
                  sStack_d8 = sStack_2d8;
                  pvStack_d0 = pvStack_2d0;
                  piStack_c8 = piStack_2c8;
                  local_c0 = local_2c0;
                  pAStack_b8 = pAStack_2b8;
                  uStack_b0 = uStack_2b0;
                  uStack_a8 = uStack_2a8;
                  local_a0 = local_2a0;
                  pvStack_98 = pvStack_298;
                  piStack_90 = piStack_290;
                  sStack_88 = sStack_288;
                  local_80 = local_280;
                  uStack_78 = uStack_278;
                  uStack_70 = uStack_270;
                  uStack_68 = uStack_268;
                  uStack_48 = uStack_248;
                }
                for (; local_13ec < local_1118; local_13ec = local_13ec + 1) {
                  *local_13b0 = *(float *)&local_1350->data;
                  *local_13b8 = *(float *)((long)&local_1350->data + 4);
                  *local_13c0 = *(float *)&local_1350->refcount;
                  *local_13c8 = *(float *)((long)&local_1350->refcount + 4);
                  *local_13d0 = *(float *)&local_1350->elemsize;
                  *local_13d8 = *(float *)((long)&local_1350->elemsize + 4);
                  *local_13e0 = (float)local_1350->elempack;
                  *(undefined4 *)*local_13e8 = *(undefined4 *)&local_1350->field_0x1c;
                  local_1350 = (Mat *)&local_1350->allocator;
                  local_13e8 = (undefined1 (*) [32])(*local_13e8 + 4);
                  local_13e0 = local_13e0 + 1;
                  local_13d8 = local_13d8 + 1;
                  local_13d0 = local_13d0 + 1;
                  local_13c8 = local_13c8 + 1;
                  local_13c0 = local_13c0 + 1;
                  local_13b8 = local_13b8 + 1;
                  local_13b0 = local_13b0 + 1;
                }
              }
            }
            if (local_1114 == 4) {
              for (local_1504 = 0; local_1504 < local_1108; local_1504 = local_1504 + 1) {
                pMVar22 = (Mat *)&stack0xffffffffffffeaa8;
                ncnn::Mat::channel((Mat *)CONCAT44(in_stack_ffffffffffffe954,
                                                   in_stack_ffffffffffffe950),
                                   (int)((ulong)in_stack_ffffffffffffe948 >> 0x20));
                pauVar21 = (undefined1 (*) [16])ncnn::Mat::operator_cast_to_float_(pMVar22);
                ncnn::Mat::~Mat((Mat *)0x38df2b);
                local_1560 = ncnn::Mat::operator_cast_to_float_(local_10e8);
                local_1560 = local_1560 + local_1118 * local_1504 * 4;
                local_1568 = ncnn::Mat::operator_cast_to_float_(local_10e8);
                local_1568 = local_1568 + local_1118 * (local_1504 * 4 + 1);
                local_1570 = ncnn::Mat::operator_cast_to_float_(local_10e8);
                local_1570 = local_1570 + local_1118 * (local_1504 * 4 + 2);
                pfVar20 = ncnn::Mat::operator_cast_to_float_(local_10e8);
                local_1578 = (undefined1 (*) [16])(pfVar20 + local_1118 * (local_1504 * 4 + 3));
                for (local_157c = 0; pauVar23 = pauVar21, local_157c + 3 < local_1118;
                    local_157c = local_157c + 4) {
                  local_710 = *(undefined8 *)*pauVar23;
                  uStack_708 = *(undefined8 *)(*pauVar23 + 8);
                  local_770 = pauVar23 + 1;
                  local_720 = *(undefined8 *)*local_770;
                  uStack_718 = *(undefined8 *)(pauVar23[1] + 8);
                  local_778 = pauVar23 + 2;
                  local_730 = *(undefined8 *)*local_778;
                  uStack_728 = *(undefined8 *)(pauVar23[2] + 8);
                  local_780 = pauVar23 + 3;
                  local_740 = *(undefined8 *)*local_780;
                  uStack_738 = *(undefined8 *)(pauVar23[3] + 8);
                  auVar4 = vunpcklps_avx(*pauVar23,*local_770);
                  auVar5 = vunpcklps_avx(*local_778,*local_780);
                  auVar1 = vunpckhps_avx(*pauVar23,*local_770);
                  auVar2 = vunpckhps_avx(*local_778,*local_780);
                  local_1600 = auVar4._0_8_;
                  local_610 = local_1600;
                  uStack_15f8 = auVar4._8_8_;
                  uStack_608 = uStack_15f8;
                  local_15e0 = auVar5._0_8_;
                  local_620 = local_15e0;
                  uStack_15d8 = auVar5._8_8_;
                  uStack_618 = uStack_15d8;
                  auVar3 = vunpcklpd_avx(auVar4,auVar5);
                  local_590 = local_15e0;
                  uStack_588 = uStack_15d8;
                  local_5a0 = local_1600;
                  uStack_598 = uStack_15f8;
                  auVar4 = vunpckhpd_avx(auVar4,auVar5);
                  local_15f0 = auVar1._0_8_;
                  local_630 = local_15f0;
                  uStack_15e8 = auVar1._8_8_;
                  uStack_628 = uStack_15e8;
                  local_15d0 = auVar2._0_8_;
                  local_640 = local_15d0;
                  uStack_15c8 = auVar2._8_8_;
                  uStack_638 = uStack_15c8;
                  auVar5 = vunpcklpd_avx(auVar1,auVar2);
                  local_5b0 = local_15d0;
                  uStack_5a8 = uStack_15c8;
                  local_5c0 = local_15f0;
                  uStack_5b8 = uStack_15e8;
                  auVar1 = vunpckhpd_avx(auVar1,auVar2);
                  local_4c8 = local_1560;
                  local_1590 = auVar3._0_8_;
                  local_4e0 = local_1590;
                  uStack_1588 = auVar3._8_8_;
                  uStack_4d8 = uStack_1588;
                  *(undefined8 *)local_1560 = local_1590;
                  *(undefined8 *)(local_1560 + 2) = uStack_1588;
                  local_4e8 = local_1568;
                  local_15a0 = auVar4._0_8_;
                  local_500 = local_15a0;
                  uStack_1598 = auVar4._8_8_;
                  uStack_4f8 = uStack_1598;
                  *(undefined8 *)local_1568 = local_15a0;
                  *(undefined8 *)(local_1568 + 2) = uStack_1598;
                  local_508 = local_1570;
                  local_15b0 = auVar5._0_8_;
                  local_520 = local_15b0;
                  uStack_15a8 = auVar5._8_8_;
                  uStack_518 = uStack_15a8;
                  *(undefined8 *)local_1570 = local_15b0;
                  *(undefined8 *)(local_1570 + 2) = uStack_15a8;
                  local_528 = local_1578;
                  local_15c0 = auVar1._0_8_;
                  local_540 = local_15c0;
                  uStack_15b8 = auVar1._8_8_;
                  uStack_538 = uStack_15b8;
                  *local_1578 = auVar1;
                  local_1560 = local_1560 + 4;
                  local_1568 = local_1568 + 4;
                  local_1570 = local_1570 + 4;
                  local_1578 = local_1578 + 1;
                  pauVar21 = pauVar23 + 4;
                  local_768 = pauVar23;
                  local_6c0 = local_740;
                  uStack_6b8 = uStack_738;
                  local_6b0 = local_730;
                  uStack_6a8 = uStack_728;
                  local_6a0 = local_720;
                  uStack_698 = uStack_718;
                  local_690 = local_710;
                  uStack_688 = uStack_708;
                }
                for (; local_157c < local_1118; local_157c = local_157c + 1) {
                  *local_1560 = *(float *)*pauVar23;
                  *local_1568 = *(float *)(*pauVar23 + 4);
                  *local_1570 = *(float *)(*pauVar23 + 8);
                  *(undefined4 *)*local_1578 = *(undefined4 *)(*pauVar23 + 0xc);
                  pauVar23 = pauVar23 + 1;
                  local_1578 = (undefined1 (*) [16])(*local_1578 + 4);
                  local_1570 = local_1570 + 1;
                  local_1568 = local_1568 + 1;
                  local_1560 = local_1560 + 1;
                }
              }
            }
            if (local_1114 == 1) {
              for (local_1604 = 0; local_1604 < local_1108; local_1604 = local_1604 + 1) {
                ncnn::Mat::channel((Mat *)CONCAT44(in_stack_ffffffffffffe954,
                                                   in_stack_ffffffffffffe950),
                                   (int)((ulong)in_stack_ffffffffffffe948 >> 0x20));
                local_1610 = (undefined1 (*) [32])
                             ncnn::Mat::operator_cast_to_float_((Mat *)&stack0xffffffffffffe9a8);
                ncnn::Mat::~Mat((Mat *)0x38e5c7);
                pfVar20 = ncnn::Mat::operator_cast_to_float_(local_10e8);
                local_1660 = (undefined1 (*) [32])(pfVar20 + local_1118 * local_1604);
                for (local_1664 = 0; local_1664 + 7 < local_1118; local_1664 = local_1664 + 8) {
                  local_10c8 = local_1610;
                  local_bc0 = *(undefined8 *)*local_1610;
                  uStack_bb8 = *(undefined8 *)(*local_1610 + 8);
                  uStack_bb0 = *(undefined8 *)(*local_1610 + 0x10);
                  uStack_ba8 = *(undefined8 *)(*local_1610 + 0x18);
                  local_b88 = local_1660;
                  *local_1660 = *local_1610;
                  local_1610 = local_1610 + 1;
                  local_1660 = local_1660 + 1;
                }
                for (; local_1664 < local_1118; local_1664 = local_1664 + 1) {
                  *(undefined4 *)*local_1660 = *(undefined4 *)*local_1610;
                  local_1660 = (undefined1 (*) [32])(*local_1660 + 4);
                  local_1610 = (undefined1 (*) [32])(*local_1610 + 4);
                }
              }
            }
          }
          local_10cc = 0;
        }
      }
    }
  }
  return local_10cc;
}

Assistant:

int Flatten_x86_avx2::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int elembits = bottom_blob.elembits();

    if (elembits == 8)
        return forward_int8(bottom_blob, top_blob, opt);

    int dims = bottom_blob.dims;

    if (dims == 1)
    {
        top_blob = bottom_blob;
        return 0;
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;
    int size = w * h * d;

    int total = size * channels * elempack;

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX__
        out_elempack = total % 8 == 0 ? 8 : total % 4 == 0 ? 4 : 1;
#else
        out_elempack = total % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    if (out_elempack == 1)
    {
        return Flatten::forward(bottom_blob, top_blob, opt);
    }

    if (dims == 2 && elempack == 1) // out_elempack == 4 || out_elempack == 8
    {
        top_blob = bottom_blob;
        top_blob.dims = 1;
        top_blob.w = total / out_elempack;
        top_blob.h = 1;
        top_blob.cstep = top_blob.w;
        top_blob.elemsize = out_elemsize;
        top_blob.elempack = out_elempack;
        return 0;
    }

    top_blob.create(total / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    if (dims == 2)
    {
#if __SSE2__
#if __AVX__
        if (elempack == 8) // out_elempack == 8
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const float* ptr = bottom_blob.row(i);
                float* outptr0 = (float*)top_blob + w * i * 8;
                float* outptr1 = (float*)top_blob + w * (i * 8 + 1);
                float* outptr2 = (float*)top_blob + w * (i * 8 + 2);
                float* outptr3 = (float*)top_blob + w * (i * 8 + 3);
                float* outptr4 = (float*)top_blob + w * (i * 8 + 4);
                float* outptr5 = (float*)top_blob + w * (i * 8 + 5);
                float* outptr6 = (float*)top_blob + w * (i * 8 + 6);
                float* outptr7 = (float*)top_blob + w * (i * 8 + 7);

                int j = 0;
                for (; j + 7 < w; j += 8)
                {
                    __m256 _row0 = _mm256_loadu_ps(ptr);
                    __m256 _row1 = _mm256_loadu_ps(ptr + 8);
                    __m256 _row2 = _mm256_loadu_ps(ptr + 16);
                    __m256 _row3 = _mm256_loadu_ps(ptr + 24);
                    __m256 _row4 = _mm256_loadu_ps(ptr + 32);
                    __m256 _row5 = _mm256_loadu_ps(ptr + 40);
                    __m256 _row6 = _mm256_loadu_ps(ptr + 48);
                    __m256 _row7 = _mm256_loadu_ps(ptr + 56);

                    transpose8_ps(_row0, _row1, _row2, _row3, _row4, _row5, _row6, _row7);

                    _mm256_storeu_ps(outptr0, _row0);
                    _mm256_storeu_ps(outptr1, _row1);
                    _mm256_storeu_ps(outptr2, _row2);
                    _mm256_storeu_ps(outptr3, _row3);
                    _mm256_storeu_ps(outptr4, _row4);
                    _mm256_storeu_ps(outptr5, _row5);
                    _mm256_storeu_ps(outptr6, _row6);
                    _mm256_storeu_ps(outptr7, _row7);

                    outptr0 += 8;
                    outptr1 += 8;
                    outptr2 += 8;
                    outptr3 += 8;
                    outptr4 += 8;
                    outptr5 += 8;
                    outptr6 += 8;
                    outptr7 += 8;
                    ptr += 64;
                }
                for (; j < w; j++)
                {
                    *outptr0++ = ptr[0];
                    *outptr1++ = ptr[1];
                    *outptr2++ = ptr[2];
                    *outptr3++ = ptr[3];
                    *outptr4++ = ptr[4];
                    *outptr5++ = ptr[5];
                    *outptr6++ = ptr[6];
                    *outptr7++ = ptr[7];

                    ptr += 8;
                }
            }
        }
#endif // __AVX__

        if (elempack == 4) // out_elempack == 4 || out_elempack == 8
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const float* ptr = bottom_blob.row(i);
                float* outptr0 = (float*)top_blob + w * i * 4;
                float* outptr1 = (float*)top_blob + w * (i * 4 + 1);
                float* outptr2 = (float*)top_blob + w * (i * 4 + 2);
                float* outptr3 = (float*)top_blob + w * (i * 4 + 3);

                int j = 0;
                for (; j + 3 < w; j += 4)
                {
                    __m128 _row0 = _mm_loadu_ps(ptr);
                    __m128 _row1 = _mm_loadu_ps(ptr + 4);
                    __m128 _row2 = _mm_loadu_ps(ptr + 8);
                    __m128 _row3 = _mm_loadu_ps(ptr + 12);

                    _MM_TRANSPOSE4_PS(_row0, _row1, _row2, _row3);

                    _mm_storeu_ps(outptr0, _row0);
                    _mm_storeu_ps(outptr1, _row1);
                    _mm_storeu_ps(outptr2, _row2);
                    _mm_storeu_ps(outptr3, _row3);

                    ptr += 16;
                    outptr0 += 4;
                    outptr1 += 4;
                    outptr2 += 4;
                    outptr3 += 4;
                }
                for (; j < w; j++)
                {
                    *outptr0++ = ptr[0];
                    *outptr1++ = ptr[1];
                    *outptr2++ = ptr[2];
                    *outptr3++ = ptr[3];

                    ptr += 4;
                }
            }
        }
#endif // __SSE2__
    }

    if (dims == 3 || dims == 4)
    {
#if __SSE2__
#if __AVX__
        if (elempack == 8) // out_elempack == 8
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                float* outptr0 = (float*)top_blob + size * q * 8;
                float* outptr1 = (float*)top_blob + size * (q * 8 + 1);
                float* outptr2 = (float*)top_blob + size * (q * 8 + 2);
                float* outptr3 = (float*)top_blob + size * (q * 8 + 3);
                float* outptr4 = (float*)top_blob + size * (q * 8 + 4);
                float* outptr5 = (float*)top_blob + size * (q * 8 + 5);
                float* outptr6 = (float*)top_blob + size * (q * 8 + 6);
                float* outptr7 = (float*)top_blob + size * (q * 8 + 7);

                int i = 0;
                for (; i + 7 < size; i += 8)
                {
                    __m256 _row0 = _mm256_loadu_ps(ptr);
                    __m256 _row1 = _mm256_loadu_ps(ptr + 8);
                    __m256 _row2 = _mm256_loadu_ps(ptr + 16);
                    __m256 _row3 = _mm256_loadu_ps(ptr + 24);
                    __m256 _row4 = _mm256_loadu_ps(ptr + 32);
                    __m256 _row5 = _mm256_loadu_ps(ptr + 40);
                    __m256 _row6 = _mm256_loadu_ps(ptr + 48);
                    __m256 _row7 = _mm256_loadu_ps(ptr + 56);

                    transpose8_ps(_row0, _row1, _row2, _row3, _row4, _row5, _row6, _row7);

                    _mm256_storeu_ps(outptr0, _row0);
                    _mm256_storeu_ps(outptr1, _row1);
                    _mm256_storeu_ps(outptr2, _row2);
                    _mm256_storeu_ps(outptr3, _row3);
                    _mm256_storeu_ps(outptr4, _row4);
                    _mm256_storeu_ps(outptr5, _row5);
                    _mm256_storeu_ps(outptr6, _row6);
                    _mm256_storeu_ps(outptr7, _row7);

                    outptr0 += 8;
                    outptr1 += 8;
                    outptr2 += 8;
                    outptr3 += 8;
                    outptr4 += 8;
                    outptr5 += 8;
                    outptr6 += 8;
                    outptr7 += 8;
                    ptr += 64;
                }
                for (; i < size; i++)
                {
                    *outptr0++ = ptr[0];
                    *outptr1++ = ptr[1];
                    *outptr2++ = ptr[2];
                    *outptr3++ = ptr[3];
                    *outptr4++ = ptr[4];
                    *outptr5++ = ptr[5];
                    *outptr6++ = ptr[6];
                    *outptr7++ = ptr[7];

                    ptr += 8;
                }
            }
        }
#endif // __AVX__

        if (elempack == 4) // out_elempack == 4 || out_elempack == 8
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                float* outptr0 = (float*)top_blob + size * q * 4;
                float* outptr1 = (float*)top_blob + size * (q * 4 + 1);
                float* outptr2 = (float*)top_blob + size * (q * 4 + 2);
                float* outptr3 = (float*)top_blob + size * (q * 4 + 3);

                int i = 0;
                for (; i + 3 < size; i += 4)
                {
                    __m128 _row0 = _mm_loadu_ps(ptr);
                    __m128 _row1 = _mm_loadu_ps(ptr + 4);
                    __m128 _row2 = _mm_loadu_ps(ptr + 8);
                    __m128 _row3 = _mm_loadu_ps(ptr + 12);

                    _MM_TRANSPOSE4_PS(_row0, _row1, _row2, _row3);

                    _mm_storeu_ps(outptr0, _row0);
                    _mm_storeu_ps(outptr1, _row1);
                    _mm_storeu_ps(outptr2, _row2);
                    _mm_storeu_ps(outptr3, _row3);

                    ptr += 16;
                    outptr0 += 4;
                    outptr1 += 4;
                    outptr2 += 4;
                    outptr3 += 4;
                }
                for (; i < size; i++)
                {
                    *outptr0++ = ptr[0];
                    *outptr1++ = ptr[1];
                    *outptr2++ = ptr[2];
                    *outptr3++ = ptr[3];

                    ptr += 4;
                }
            }
        }
#endif // __SSE2__

        if (elempack == 1) // out_elempack == 4 || out_elempack == 8
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                float* outptr = (float*)top_blob + size * q;

                int i = 0;
#if __AVX__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _v = _mm256_loadu_ps(ptr);
                    _mm256_storeu_ps(outptr, _v);
                    ptr += 8;
                    outptr += 8;
                }
#endif
                for (; i < size; i++)
                {
                    *outptr++ = *ptr++;
                }
            }
        }
    }

    return 0;
}